

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall
wirehair::Codec::ReconstructBlock(Codec *this,uint16_t block_id,void *block_out,uint32_t *bytes_out)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t bytes;
  uint8_t *puVar3;
  WirehairResult WVar4;
  uint uVar5;
  uint uVar6;
  Codec *pCVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  short sVar15;
  PeelRow *pPVar16;
  short sVar17;
  uint i;
  long lVar18;
  uint16_t peel_x;
  RowMixIterator mix;
  PeelRowParameters params;
  ushort local_52 [3];
  int local_4c;
  uint32_t *local_48;
  PeelRowParameters local_3a;
  
  if ((block_out == (void *)0x0) || (uVar1 = this->_block_count, uVar1 <= block_id)) {
    *bytes_out = 0;
    WVar4 = Wirehair_InvalidInput;
  }
  else if (this->_all_original == true) {
    WVar4 = Wirehair_Error;
    if (this->_row_count != 0) {
      pPVar16 = this->_peel_rows;
      iVar14 = 0;
      do {
        if (pPVar16->RecoveryId == (uint)block_id) {
          pCVar7 = (Codec *)&this->_output_final_bytes;
          if (pPVar16->RecoveryId != uVar1 - 1) {
            pCVar7 = this;
          }
          uVar9 = pCVar7->_block_bytes;
          memcpy(block_out,this->_input_blocks + iVar14 * this->_block_bytes,(ulong)uVar9);
          *bytes_out = uVar9;
          goto LAB_001073e3;
        }
        iVar14 = iVar14 + 1;
        pPVar16 = pPVar16 + 1;
      } while (this->_row_count != (uint16_t)iVar14);
    }
  }
  else {
    pCVar7 = (Codec *)&this->_output_final_bytes;
    if (uVar1 - 1 != (uint)block_id) {
      pCVar7 = this;
    }
    bytes = pCVar7->_block_bytes;
    local_48 = bytes_out;
    PeelRowParameters::Initialize(&local_3a,(uint)block_id,this->_p_seed,uVar1,this->_mix_count);
    uVar5 = (uint)this->_block_count;
    uVar6 = (uint)this->_block_next_prime;
    uVar10 = (uint)local_3a.PeelFirst;
    uVar13 = (uint)local_3a.PeelAdd;
    uVar1 = this->_mix_count;
    uVar2 = this->_mix_next_prime;
    uVar8 = (uint)local_3a.MixFirst;
    local_52[0] = local_3a.MixFirst;
    lVar18 = 1;
    uVar9 = uVar8;
    do {
      uVar9 = ((uVar9 & 0xffff) + (uint)local_3a.MixAdd) % (uint)uVar2;
      if (uVar1 <= uVar9) {
        uVar9 = uVar2 - uVar9;
        uVar12 = uVar9 & 0xffff;
        if (local_3a.MixAdd < (ushort)uVar9) {
          uVar9 = ((uint)local_3a.MixAdd * 0x10000 - uVar12) % (uint)local_3a.MixAdd;
        }
        else {
          uVar9 = local_3a.MixAdd - uVar12;
        }
      }
      local_52[lVar18] = (ushort)uVar9;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    puVar3 = this->_recovery_blocks;
    uVar9 = this->_block_bytes;
    uVar12 = uVar9 * uVar10;
    sVar17 = local_3a.PeelCount - 1;
    sVar15 = sVar17;
    if (sVar17 != 0) {
      sVar15 = local_3a.PeelCount - 2;
      uVar10 = (uVar10 + local_3a.PeelAdd) % uVar6;
      if (uVar5 <= uVar10) {
        uVar11 = uVar6 - uVar10 & 0xffff;
        if (local_3a.PeelAdd < (ushort)(uVar6 - uVar10)) {
          uVar10 = (uVar13 * 0x10000 - uVar11) % uVar13;
        }
        else {
          uVar10 = local_3a.PeelAdd - uVar11;
        }
      }
    }
    if (sVar17 == 0) {
      gf256_addset_mem(block_out,puVar3 + uVar12,puVar3 + uVar9 * (uVar8 + uVar5),bytes);
    }
    else {
      gf256_addset_mem(block_out,puVar3 + uVar12,puVar3 + uVar9 * (uVar10 & 0xffff),bytes);
      local_4c = uVar13 << 0x10;
      while( true ) {
        sVar17 = sVar15;
        if (sVar15 != 0) {
          sVar17 = sVar15 + -1;
          uVar10 = ((uVar10 & 0xffff) + uVar13) % uVar6;
          if (uVar5 <= uVar10) {
            uVar9 = uVar6 - uVar10 & 0xffff;
            if (local_3a.PeelAdd < (ushort)(uVar6 - uVar10)) {
              uVar10 = (local_4c - uVar9) % uVar13;
            }
            else {
              uVar10 = uVar13 - uVar9;
            }
          }
        }
        if (sVar15 == 0) break;
        gf256_add_mem(block_out,this->_recovery_blocks + this->_block_bytes * (uVar10 & 0xffff),
                      bytes);
        sVar15 = sVar17;
      }
      gf256_add_mem(block_out,
                    this->_recovery_blocks + (this->_block_count + uVar8) * this->_block_bytes,bytes
                   );
    }
    gf256_add2_mem(block_out,
                   this->_recovery_blocks +
                   ((uint)local_52[1] + (uint)this->_block_count) * this->_block_bytes,
                   this->_recovery_blocks +
                   ((uint)local_52[2] + (uint)this->_block_count) * this->_block_bytes,bytes);
    *local_48 = bytes;
LAB_001073e3:
    WVar4 = Wirehair_Success;
  }
  return WVar4;
}

Assistant:

WirehairResult Codec::ReconstructBlock(
    const uint16_t block_id, ///< Block identifier
    void * GF256_RESTRICT block_out, ///< Output block memory
    uint32_t* bytes_out ///< Bytes written to output
)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructBlock ----" << endl << endl;)

    // Validate input
    if (!block_out || block_id >= _block_count)
    {
        *bytes_out = 0;
        return Wirehair_InvalidInput;
    }

#if defined(CAT_ALL_ORIGINAL)
    // If decoder received only original data out of order:
    if (_all_original)
    {
        PeelRow * GF256_RESTRICT row = _peel_rows;
        const uint8_t * GF256_RESTRICT src = _input_blocks;

        // For each row that was received:
        for (uint16_t row_i = 0, count = _row_count; row_i < count; ++row_i)
        {
            const uint32_t id = row[row_i].RecoveryId;

            // If this is the id we seek:
            if (id == block_id)
            {
                CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

                const unsigned bytes = (id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

                memcpy(block_out, src + row_i * _block_bytes, bytes);

                *bytes_out = (uint32_t)bytes;

                return Wirehair_Success;
            }
        }

        return Wirehair_Error;
    }
#endif

    // Regenerate any single row that got lost:

    uint32_t block_bytes = _block_bytes;

    // For last row, use final byte count
    if (block_id == _block_count - 1) {
        block_bytes = _output_final_bytes;
    }

    CAT_IF_DUMP(cout << "Regenerating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    // If this row references multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            block_bytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                block_out,
                _recovery_blocks + _block_bytes * peel_x,
                block_bytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(
            block_out,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Combine remaining two mixer columns together:
    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(block_out, mix0_src, mix1_src, block_bytes);

    CAT_IF_DUMP(cout << endl;)

    *bytes_out = static_cast<uint32_t>(block_bytes);
    return Wirehair_Success;
}